

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,uint64_t aNid,string *aMessage,Color aColor)

{
  Interpreter *this_00;
  string nidHex;
  undefined1 auStack_78 [32];
  string local_58;
  string local_38;
  
  this_00 = (Interpreter *)auStack_78;
  utils::Hex<unsigned_long>(&local_38,aNid);
  std::__cxx11::string::string((string *)(auStack_78 + 0x20),(string *)&local_38);
  std::__cxx11::string::string((string *)auStack_78,(string *)aMessage);
  PrintNetworkMessage(this_00,(string *)(auStack_78 + 0x20),(string *)auStack_78,aColor);
  std::__cxx11::string::~string((string *)auStack_78);
  std::__cxx11::string::~string((string *)(auStack_78 + 0x20));
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(uint64_t aNid, std::string aMessage, Console::Color aColor)
{
    std::string nidHex = utils::Hex(aNid);
    PrintNetworkMessage(nidHex, aMessage, aColor);
}